

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnificationWithAbstraction.cpp
# Opt level: O2

FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *
Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>_>_>::
scanAdd(FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
        *__return_storage_ptr__,AbstractingUnifier *au,TermSpec *t0,TermSpec *t1)

{
  FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  FStack_138;
  FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_> local_a8
  ;
  
  scan(&local_a8,au,t0);
  scan(&FStack_138,au,t1);
  add(__return_storage_ptr__,au,&local_a8,&FStack_138);
  ~FloorUwaState((FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                  *)&FStack_138);
  ~FloorUwaState((FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                  *)&local_a8);
  return __return_storage_ptr__;
}

Assistant:

static FloorUwaState scanAdd(AbstractingUnifier& au, TermSpec const& t0, TermSpec const& t1) { return add(au, scan(au, t0), scan(au, t1)); }